

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  int img_n_00;
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  int in_ECX;
  uint uVar7;
  byte *__src;
  uint in_EDX;
  byte *in_RSI;
  long *in_RDI;
  uint in_R8D;
  uint in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  stbi__uint32 nsmp_1;
  stbi__uint16 *dest16;
  stbi__uint32 nsmp;
  stbi_uc inb;
  stbi_uc *out;
  stbi_uc *in;
  stbi_uc scale;
  int filter;
  int nk;
  stbi_uc *dest;
  stbi_uc *prior;
  stbi_uc *cur;
  int width;
  int filter_bytes;
  int output_bytes;
  int img_n;
  int k;
  int all_ok;
  stbi_uc *filter_buf;
  stbi__uint32 img_width_bytes;
  stbi__uint32 img_len;
  stbi__uint32 stride;
  stbi__uint32 j;
  stbi__uint32 i;
  stbi__context *s;
  int bytes;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  stbi_uc *local_b8;
  byte local_a9;
  stbi_uc *local_a8;
  byte *local_a0;
  uint local_90;
  byte *local_78;
  uint local_70;
  int local_6c;
  int local_60;
  int local_5c;
  uint local_40;
  uint local_3c;
  byte *local_18;
  int local_4;
  
  iVar2 = 1;
  if (in_stack_00000008 == 0x10) {
    iVar2 = 2;
  }
  local_5c = 1;
  img_n_00 = *(int *)(*in_RDI + 8);
  local_6c = img_n_00 * iVar2;
  pvVar6 = stbi__malloc_mad3(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0,0x1b6240);
  in_RDI[3] = (long)pvVar6;
  if (in_RDI[3] == 0) {
    local_4 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  else {
    iVar3 = stbi__mad3sizes_valid
                      (in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c
                       ,in_stack_ffffffffffffff28);
    if (iVar3 == 0) {
      local_4 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    }
    else {
      uVar4 = img_n_00 * in_R8D * in_stack_00000008 + 7 >> 3;
      iVar3 = stbi__mad2sizes_valid
                        (in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff2c);
      if (iVar3 == 0) {
        local_4 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
      else if (in_EDX < (uVar4 + 1) * in_R9D) {
        local_4 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
      else {
        pvVar6 = stbi__malloc_mad2(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
        if (pvVar6 == (void *)0x0) {
          local_4 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
          ;
        }
        else {
          local_70 = in_R8D;
          if (in_stack_00000008 < 8) {
            local_6c = 1;
            local_70 = uVar4;
          }
          local_18 = in_RSI;
          for (local_40 = 0; local_40 < in_R9D; local_40 = local_40 + 1) {
            local_a0 = (byte *)((long)pvVar6 + (ulong)((local_40 & 1) * uVar4));
            uVar7 = ((local_40 ^ 0xffffffff) & 1) * uVar4;
            local_b8 = (stbi_uc *)(in_RDI[3] + (ulong)(in_R8D * in_ECX * iVar2 * local_40));
            iVar3 = local_70 * local_6c;
            __src = local_18 + 1;
            local_90 = (uint)*local_18;
            if (4 < local_90) {
              local_5c = stbi__err((char *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30));
              break;
            }
            if (local_40 == 0) {
              local_90 = (uint)first_row_filter[(int)local_90];
            }
            switch(local_90) {
            case 0:
              memcpy(local_a0,__src,(long)iVar3);
              break;
            case 1:
              memcpy(local_a0,__src,(long)local_6c);
              for (local_60 = local_6c; local_60 < iVar3; local_60 = local_60 + 1) {
                local_a0[local_60] = __src[local_60] + local_a0[local_60 - local_6c];
              }
              break;
            case 2:
              for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
                local_a0[local_60] =
                     __src[local_60] + *(char *)((long)pvVar6 + (long)local_60 + (ulong)uVar7);
              }
              break;
            case 3:
              for (local_60 = 0; local_60 < local_6c; local_60 = local_60 + 1) {
                local_a0[local_60] =
                     __src[local_60] +
                     (char)((int)(uint)*(byte *)((long)pvVar6 + (long)local_60 + (ulong)uVar7) >> 1)
                ;
              }
              for (local_60 = local_6c; local_60 < iVar3; local_60 = local_60 + 1) {
                local_a0[local_60] =
                     __src[local_60] +
                     (char)((int)((uint)*(byte *)((long)pvVar6 + (long)local_60 + (ulong)uVar7) +
                                 (uint)local_a0[local_60 - local_6c]) >> 1);
              }
              break;
            case 4:
              for (local_60 = 0; local_60 < local_6c; local_60 = local_60 + 1) {
                local_a0[local_60] =
                     __src[local_60] + *(char *)((long)pvVar6 + (long)local_60 + (ulong)uVar7);
              }
              for (local_60 = local_6c; local_60 < iVar3; local_60 = local_60 + 1) {
                in_stack_ffffffffffffff34 = (uint)__src[local_60];
                iVar5 = stbi__paeth((uint)local_a0[local_60 - local_6c],
                                    (uint)*(byte *)((long)pvVar6 + (long)local_60 + (ulong)uVar7),
                                    (uint)*(byte *)((long)pvVar6 +
                                                   (long)(local_60 - local_6c) + (ulong)uVar7));
                local_a0[local_60] = (char)in_stack_ffffffffffffff34 + (char)iVar5;
              }
              break;
            case 5:
              memcpy(local_a0,__src,(long)local_6c);
              for (local_60 = local_6c; local_60 < iVar3; local_60 = local_60 + 1) {
                local_a0[local_60] =
                     __src[local_60] + (char)((int)(uint)local_a0[local_60 - local_6c] >> 1);
              }
            }
            local_18 = __src + iVar3;
            if (in_stack_00000008 < 8) {
              if (in_stack_00000010 == 0) {
                in_stack_ffffffffffffff30 = (uint)""[in_stack_00000008];
              }
              else {
                in_stack_ffffffffffffff30 = 1;
              }
              cVar1 = (char)in_stack_ffffffffffffff30;
              local_a9 = 0;
              uVar7 = in_R8D * img_n_00;
              if (in_stack_00000008 == 4) {
                local_a8 = local_b8;
                for (local_3c = 0; local_3c < uVar7; local_3c = local_3c + 1) {
                  if ((local_3c & 1) == 0) {
                    local_a9 = *local_a0;
                    local_a0 = local_a0 + 1;
                  }
                  *local_a8 = cVar1 * (char)((int)(uint)local_a9 >> 4);
                  local_a9 = local_a9 << 4;
                  local_a8 = local_a8 + 1;
                }
              }
              else if (in_stack_00000008 == 2) {
                local_a8 = local_b8;
                for (local_3c = 0; local_3c < uVar7; local_3c = local_3c + 1) {
                  if ((local_3c & 3) == 0) {
                    local_a9 = *local_a0;
                    local_a0 = local_a0 + 1;
                  }
                  *local_a8 = cVar1 * (char)((int)(uint)local_a9 >> 6);
                  local_a9 = local_a9 << 2;
                  local_a8 = local_a8 + 1;
                }
              }
              else {
                local_a8 = local_b8;
                for (local_3c = 0; local_3c < uVar7; local_3c = local_3c + 1) {
                  if ((local_3c & 7) == 0) {
                    local_a9 = *local_a0;
                    local_a0 = local_a0 + 1;
                  }
                  *local_a8 = cVar1 * (char)((int)(uint)local_a9 >> 7);
                  local_a9 = local_a9 << 1;
                  local_a8 = local_a8 + 1;
                }
              }
              if (img_n_00 != in_ECX) {
                stbi__create_png_alpha_expand8(local_b8,local_b8,in_R8D,img_n_00);
              }
            }
            else if (in_stack_00000008 == 8) {
              if (img_n_00 == in_ECX) {
                memcpy(local_b8,local_a0,(ulong)(in_R8D * img_n_00));
              }
              else {
                stbi__create_png_alpha_expand8(local_b8,local_a0,in_R8D,img_n_00);
              }
            }
            else if (in_stack_00000008 == 0x10) {
              local_78 = local_a0;
              if (img_n_00 == in_ECX) {
                for (local_3c = 0; local_3c < in_R8D * img_n_00; local_3c = local_3c + 1) {
                  *(ushort *)local_b8 = CONCAT11(*local_78,local_78[1]);
                  local_b8 = local_b8 + 2;
                  local_78 = local_78 + 2;
                }
              }
              else if (img_n_00 == 1) {
                for (local_3c = 0; local_3c < in_R8D; local_3c = local_3c + 1) {
                  *(ushort *)local_b8 = CONCAT11(*local_78,local_78[1]);
                  local_b8[2] = 0xff;
                  local_b8[3] = 0xff;
                  local_b8 = local_b8 + 4;
                  local_78 = local_78 + 2;
                }
              }
              else {
                for (local_3c = 0; local_3c < in_R8D; local_3c = local_3c + 1) {
                  *(ushort *)local_b8 = CONCAT11(*local_78,local_78[1]);
                  *(ushort *)(local_b8 + 2) = CONCAT11(local_78[2],local_78[3]);
                  *(ushort *)(local_b8 + 4) = CONCAT11(local_78[4],local_78[5]);
                  local_b8[6] = 0xff;
                  local_b8[7] = 0xff;
                  local_b8 = local_b8 + 8;
                  local_78 = local_78 + 6;
                }
              }
            }
          }
          free(pvVar6);
          if (local_5c == 0) {
            local_4 = 0;
          }
          else {
            local_4 = 1;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16 ? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   stbi_uc *filter_buf;
   int all_ok = 1;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   // note: error exits here don't need to clean up a->out individually,
   // stbi__do_png always does on error.
   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   if (!stbi__mad2sizes_valid(img_width_bytes, y, img_width_bytes)) return stbi__err("too large", "Corrupt PNG");
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   // Allocate two scan lines worth of filter workspace buffer.
   filter_buf = (stbi_uc *) stbi__malloc_mad2(img_width_bytes, 2, 0);
   if (!filter_buf) return stbi__err("outofmem", "Out of memory");

   // Filtering for low-bit-depth images
   if (depth < 8) {
      filter_bytes = 1;
      width = img_width_bytes;
   }

   for (j=0; j < y; ++j) {
      // cur/prior filter buffers alternate
      stbi_uc *cur = filter_buf + (j & 1)*img_width_bytes;
      stbi_uc *prior = filter_buf + (~j & 1)*img_width_bytes;
      stbi_uc *dest = a->out + stride*j;
      int nk = width * filter_bytes;
      int filter = *raw++;

      // check filter type
      if (filter > 4) {
         all_ok = stbi__err("invalid filter","Corrupt PNG");
         break;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // perform actual filtering
      switch (filter) {
      case STBI__F_none:
         memcpy(cur, raw, nk);
         break;
      case STBI__F_sub:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]);
         break;
      case STBI__F_up:
         for (k = 0; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]);
         break;
      case STBI__F_avg:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1));
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1));
         break;
      case STBI__F_paeth:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]); // prior[k] == stbi__paeth(0,prior[k],0)
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes], prior[k], prior[k-filter_bytes]));
         break;
      case STBI__F_avg_first:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1));
         break;
      }

      raw += nk;

      // expand decoded bits in cur to dest, also adding an extra alpha channel if desired
      if (depth < 8) {
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range
         stbi_uc *in = cur;
         stbi_uc *out = dest;
         stbi_uc inb = 0;
         stbi__uint32 nsmp = x*img_n;

         // expand bits to bytes first
         if (depth == 4) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 1) == 0) inb = *in++;
               *out++ = scale * (inb >> 4);
               inb <<= 4;
            }
         } else if (depth == 2) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 3) == 0) inb = *in++;
               *out++ = scale * (inb >> 6);
               inb <<= 2;
            }
         } else {
            STBI_ASSERT(depth == 1);
            for (i=0; i < nsmp; ++i) {
               if ((i & 7) == 0) inb = *in++;
               *out++ = scale * (inb >> 7);
               inb <<= 1;
            }
         }

         // insert alpha=255 values if desired
         if (img_n != out_n)
            stbi__create_png_alpha_expand8(dest, dest, x, img_n);
      } else if (depth == 8) {
         if (img_n == out_n)
            memcpy(dest, cur, x*img_n);
         else
            stbi__create_png_alpha_expand8(dest, cur, x, img_n);
      } else if (depth == 16) {
         // convert the image data from big-endian to platform-native
         stbi__uint16 *dest16 = (stbi__uint16*)dest;
         stbi__uint32 nsmp = x*img_n;

         if (img_n == out_n) {
            for (i = 0; i < nsmp; ++i, ++dest16, cur += 2)
               *dest16 = (cur[0] << 8) | cur[1];
         } else {
            STBI_ASSERT(img_n+1 == out_n);
            if (img_n == 1) {
               for (i = 0; i < x; ++i, dest16 += 2, cur += 2) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = 0xffff;
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i = 0; i < x; ++i, dest16 += 4, cur += 6) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = (cur[2] << 8) | cur[3];
                  dest16[2] = (cur[4] << 8) | cur[5];
                  dest16[3] = 0xffff;
               }
            }
         }
      }
   }

   STBI_FREE(filter_buf);
   if (!all_ok) return 0;

   return 1;
}